

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O1

Complex * __thiscall Complex::inverse(Complex *__return_storage_ptr__,Complex *this)

{
  Rational *a;
  runtime_error *this_00;
  Rational sqmod;
  Rational local_118;
  Rational local_d8;
  Rational local_98;
  Rational local_58;
  
  ::operator*(&local_d8,&this->_re,&this->_re);
  a = &this->_im;
  ::operator*(&local_118,a,a);
  ::operator+(&local_98,&local_d8,&local_118);
  if (local_118._denominator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_118._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8._denominator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_98._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    operator/(&local_d8,&this->_re,&local_98);
    Rational::operator-(&local_58,a);
    operator/(&local_118,&local_58,&local_98);
    Complex(__return_storage_ptr__,&local_d8,&local_118);
    if (local_118._denominator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118._denominator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_118._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118._numerator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58._denominator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58._denominator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58._numerator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8._denominator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8._denominator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8._numerator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_98._denominator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98._denominator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_98._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98._numerator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Complex division by zero");
  *(undefined ***)this_00 = &PTR__runtime_error_00160d68;
  __cxa_throw(this_00,&zero_division_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Complex Complex::inverse() const
{
    Rational sqmod = _re * _re + _im * _im;
    if(!sqmod)
        throw zero_division_error("Complex division by zero");
    return Complex(_re / sqmod, -_im / sqmod);
}